

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QShaderDescription::BlockVariable>::copyAppend
          (QGenericArrayOps<QShaderDescription::BlockVariable> *this,BlockVariable *b,
          BlockVariable *e)

{
  qsizetype *pqVar1;
  BlockVariable *pBVar2;
  long lVar3;
  Data *pDVar4;
  Data *pDVar5;
  Data *pDVar6;
  int iVar7;
  
  if ((b != e) && (b < e)) {
    pBVar2 = (this->super_QArrayDataPointer<QShaderDescription::BlockVariable>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QShaderDescription::BlockVariable>).size;
      pDVar4 = (b->name).d.d;
      pBVar2[lVar3].name.d.d = pDVar4;
      pBVar2[lVar3].name.d.ptr = (b->name).d.ptr;
      pBVar2[lVar3].name.d.size = (b->name).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pBVar2[lVar3].size = b->size;
      iVar7 = b->offset;
      pBVar2[lVar3].type = b->type;
      pBVar2[lVar3].offset = iVar7;
      pDVar5 = (b->arrayDims).d.d;
      pBVar2[lVar3].arrayDims.d.d = pDVar5;
      pBVar2[lVar3].arrayDims.d.ptr = (b->arrayDims).d.ptr;
      pBVar2[lVar3].arrayDims.d.size = (b->arrayDims).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pBVar2[lVar3].matrixIsRowMajor = b->matrixIsRowMajor;
      iVar7 = b->matrixStride;
      pBVar2[lVar3].arrayStride = b->arrayStride;
      pBVar2[lVar3].matrixStride = iVar7;
      pDVar6 = (b->structMembers).d.d;
      pBVar2[lVar3].structMembers.d.d = pDVar6;
      pBVar2[lVar3].structMembers.d.ptr = (b->structMembers).d.ptr;
      pBVar2[lVar3].structMembers.d.size = (b->structMembers).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QShaderDescription::BlockVariable>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }